

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TokenKind kind)

{
  uint uVar1;
  undefined6 in_register_0000003a;
  
  uVar1 = (uint)CONCAT62(in_register_0000003a,kind);
  if ((0x12 < uVar1 - 0x8f) &&
     (((0x14 < uVar1 || ((0x194000U >> (uVar1 & 0x1f) & 1) == 0)) && (2 < uVar1 - 0xcb)))) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isCloseDelimOrKeyword(TokenKind kind) {
    switch (kind) {
        case TokenKind::CloseBrace:
        case TokenKind::CloseBracket:
        case TokenKind::CloseParenthesis:
        case TokenKind::StarCloseParenthesis:
            return true;
        default:
            return isEndKeyword(kind);
    }
}